

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::DrawStringProp
          (PixelGameEngine *this,int32_t x,int32_t y,string *sText,Pixel col,uint32_t scale)

{
  char cVar1;
  Mode m_00;
  Sprite *pSVar2;
  bool bVar3;
  int iVar4;
  Pixel PVar5;
  reference pcVar6;
  reference pvVar7;
  int iVar8;
  char local_80;
  int local_7c;
  int local_78;
  int32_t j_1;
  int32_t i_1;
  int local_6c;
  int32_t js;
  int32_t is;
  int local_60;
  int32_t j;
  int32_t i;
  int32_t oy;
  int32_t ox;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  Mode m;
  int32_t sy;
  int32_t sx;
  uint32_t scale_local;
  string *sText_local;
  int32_t y_local;
  int32_t x_local;
  PixelGameEngine *this_local;
  Pixel col_local;
  
  m = NORMAL;
  __range1._4_4_ = 0;
  m_00 = this->nPixelMode;
  if (m_00 != CUSTOM) {
    this_local._7_1_ = col.field_0._3_1_;
    if (this_local._7_1_ == -1) {
      SetPixelMode(this,MASK);
    }
    else {
      SetPixelMode(this,ALPHA);
    }
  }
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _ox = (char *)std::__cxx11::string::end();
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&ox), bVar3) {
    pcVar6 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar6;
    if (cVar1 == '\n') {
      m = NORMAL;
      __range1._4_4_ = scale * 8 + __range1._4_4_;
    }
    else {
      iVar8 = (cVar1 + -0x20) % 0x10;
      iVar4 = (cVar1 + -0x20) / 0x10;
      if (scale < 2) {
        for (local_78 = 0;
            pvVar7 = std::vector<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>::
                     operator[](&this->vFontSpacing,(long)(cVar1 + -0x20)), local_78 < pvVar7->y;
            local_78 = local_78 + 1) {
          for (local_7c = 0; local_7c < 8; local_7c = local_7c + 1) {
            pSVar2 = this->fontSprite;
            pvVar7 = std::vector<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>::
                     operator[](&this->vFontSpacing,(long)(cVar1 + -0x20));
            PVar5 = Sprite::GetPixel(pSVar2,local_78 + iVar8 * 8 + pvVar7->x,local_7c + iVar4 * 8);
            local_80 = PVar5.field_0._0_1_;
            if (local_80 != '\0') {
              (*this->_vptr_PixelGameEngine[5])
                        (this,(ulong)(x + m + local_78),(ulong)(uint)(y + __range1._4_4_ + local_7c)
                         ,(ulong)(uint)col.field_0);
            }
          }
        }
      }
      else {
        for (local_60 = 0;
            pvVar7 = std::vector<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>::
                     operator[](&this->vFontSpacing,(long)(cVar1 + -0x20)), local_60 < pvVar7->y;
            local_60 = local_60 + 1) {
          for (is = 0; is < 8; is = is + 1) {
            pSVar2 = this->fontSprite;
            pvVar7 = std::vector<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>::
                     operator[](&this->vFontSpacing,(long)(cVar1 + -0x20));
            PVar5 = Sprite::GetPixel(pSVar2,local_60 + iVar8 * 8 + pvVar7->x,is + iVar4 * 8);
            js._0_1_ = PVar5.field_0._0_1_;
            if ((char)js != '\0') {
              for (local_6c = 0; local_6c < (int)scale; local_6c = local_6c + 1) {
                for (i_1 = 0; i_1 < (int)scale; i_1 = i_1 + 1) {
                  (*this->_vptr_PixelGameEngine[5])
                            (this,(ulong)(x + m + local_60 * scale + local_6c),
                             (ulong)(y + __range1._4_4_ + is * scale + i_1),(ulong)(uint)col.field_0
                            );
                }
              }
            }
          }
        }
      }
      pvVar7 = std::vector<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>::
               operator[](&this->vFontSpacing,(long)(cVar1 + -0x20));
      m = pvVar7->y * scale + m;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  SetPixelMode(this,m_00);
  return;
}

Assistant:

void PixelGameEngine::DrawStringProp(int32_t x, int32_t y, const std::string &sText, Pixel col, uint32_t scale)
	{
		int32_t sx = 0;
		int32_t sy = 0;
		Pixel::Mode m = nPixelMode;

		if (m != Pixel::CUSTOM)
		{
			if (col.a != 255)
				SetPixelMode(Pixel::ALPHA);
			else
				SetPixelMode(Pixel::MASK);
		}
		for (auto c : sText)
		{
			if (c == '\n')
			{
				sx = 0;
				sy += 8 * scale;
			}
			else
			{
				int32_t ox = (c - 32) % 16;
				int32_t oy = (c - 32) / 16;

				if (scale > 1)
				{
					for (int32_t i = 0; i < vFontSpacing[c - 32].y; i++)
						for (int32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8 + vFontSpacing[c - 32].x, j + oy * 8).r > 0)
								for (int32_t is = 0; is < int(scale); is++)
									for (int32_t js = 0; js < int(scale); js++)
										Draw(x + sx + (i * scale) + is, y + sy + (j * scale) + js, col);
				}
				else
				{
					for (int32_t i = 0; i < vFontSpacing[c - 32].y; i++)
						for (int32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8 + vFontSpacing[c - 32].x, j + oy * 8).r > 0)
								Draw(x + sx + i, y + sy + j, col);
				}
				sx += vFontSpacing[c - 32].y * scale;
			}
		}
		SetPixelMode(m);
	}